

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v5::vprint(FILE *f,string_view format_str,format_args args)

{
  string_view format_str_00;
  char *__ptr;
  size_t __n;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  local_288;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_2
  local_278;
  size_t sStack_270;
  allocator<char> local_249;
  undefined1 local_248 [8];
  memory_buffer buffer;
  FILE *f_local;
  format_args args_local;
  string_view format_str_local;
  
  args_local.
  super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  .types_ = (unsigned_long_long)
            args.
            super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            .field_1;
  f_local = (FILE *)args.
                    super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                    .types_;
  args_local.
  super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  .field_1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_2
              )format_str.data_;
  buffer._528_8_ = f;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_248,&local_249);
  std::allocator<char>::~allocator(&local_249);
  local_278 = args_local.
              super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              .field_1;
  sStack_270 = format_str.size_;
  format_args::format_args<fmt::v5::format_args&>((format_args *)&local_288,(format_args *)&f_local)
  ;
  format_str_00.size_ = sStack_270;
  format_str_00.data_ = (char *)local_278.values_;
  vformat_to((buffer *)local_248,format_str_00,(format_args)local_288);
  __ptr = internal::basic_buffer<char>::data((basic_buffer<char> *)local_248);
  __n = internal::basic_buffer<char>::size((basic_buffer<char> *)local_248);
  fwrite(__ptr,1,__n,(FILE *)buffer._528_8_);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_248);
  return;
}

Assistant:

FMT_FUNC void vprint(std::FILE *f, string_view format_str, format_args args) {
  memory_buffer buffer;
  vformat_to(buffer, format_str, args);
  std::fwrite(buffer.data(), 1, buffer.size(), f);
}